

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O0

void __thiscall
tcu::TestSessionExecutor::enterTestPackage(TestSessionExecutor *this,TestPackage *testPackage)

{
  PtrData<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_> data;
  int iVar1;
  undefined4 extraout_var;
  TestCaseExecutor *in_stack_ffffffffffffff88;
  DefaultDeleter<tcu::TestCaseExecutor> local_39;
  PtrData<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_> local_38;
  PtrData<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_> *local_28;
  TestPackage *local_18;
  TestPackage *testPackage_local;
  TestSessionExecutor *this_local;
  MovePtr *this_00;
  
  local_18 = testPackage;
  testPackage_local = (TestPackage *)this;
  iVar1 = (*(testPackage->super_TestNode)._vptr_TestNode[5])();
  this_00 = (MovePtr *)CONCAT44(extraout_var,iVar1);
  de::DefaultDeleter<tcu::TestCaseExecutor>::DefaultDeleter(&local_39);
  de::details::MovePtr<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::MovePtr()
  ;
  local_28 = de::details::MovePtr::operator_cast_to_PtrData(&local_38,this_00);
  data._8_8_ = this;
  data.ptr = in_stack_ffffffffffffff88;
  de::details::MovePtr<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::operator=
            (&this->m_caseExecutor,data);
  de::details::MovePtr<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::~MovePtr
            ((MovePtr<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_> *)&local_38
            );
  return;
}

Assistant:

void TestSessionExecutor::enterTestPackage (TestPackage* testPackage)
{
	// Create test case wrapper
	DE_ASSERT(!m_caseExecutor);
	m_caseExecutor = de::MovePtr<TestCaseExecutor>(testPackage->createExecutor());
}